

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_sparse.c
# Opt level: O0

wchar_t archive_entry_sparse_count(archive_entry *entry)

{
  long lVar1;
  la_int64_t lVar2;
  wchar_t local_1c;
  ae_sparse *paStack_18;
  wchar_t count;
  ae_sparse *sp;
  archive_entry *entry_local;
  
  local_1c = L'\0';
  for (paStack_18 = entry->sparse_head; paStack_18 != (ae_sparse *)0x0;
      paStack_18 = paStack_18->next) {
    local_1c = local_1c + L'\x01';
  }
  if (((local_1c == L'\x01') && (entry->sparse_head->offset == 0)) &&
     (lVar1 = entry->sparse_head->length, lVar2 = archive_entry_size(entry), lVar2 <= lVar1)) {
    local_1c = L'\0';
    archive_entry_sparse_clear(entry);
  }
  return local_1c;
}

Assistant:

int
archive_entry_sparse_count(struct archive_entry *entry)
{
	struct ae_sparse *sp;
	int count = 0;

	for (sp = entry->sparse_head; sp != NULL; sp = sp->next)
		count++;

	/*
	 * Sanity check if this entry is exactly sparse.
	 * If amount of sparse blocks is just one and it indicates the whole
	 * file data, we should remove it and return zero.
	 */
	if (count == 1) {
		sp = entry->sparse_head;
		if (sp->offset == 0 &&
		    sp->length >= archive_entry_size(entry)) {
			count = 0;
			archive_entry_sparse_clear(entry);
		}
	}

	return (count);
}